

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall
Js::JavascriptLibrary::SetCrossSiteForLockedFunctionType
          (JavascriptLibrary *this,JavascriptFunction *function)

{
  code *pcVar1;
  bool bVar2;
  DynamicType *pDVar3;
  undefined4 *puVar4;
  DeferredTypeHandler<&Js::JavascriptExternalFunction::DeferredConstructorInitializer,_Js::DefaultDeferredTypeFilter,_false,_(unsigned_short)0,_(unsigned_short)0>
  *pDVar5;
  ScriptContext *pSVar6;
  DeferredTypeHandler<&Js::JavascriptExternalFunction::DeferredConstructorInitializer,_Js::DefaultDeferredTypeFilter,_false,_(unsigned_short)0,_(unsigned_short)0>
  *pDVar7;
  DynamicType **ppDVar8;
  DynamicTypeHandler *typeHandler;
  JavascriptFunction *function_local;
  JavascriptLibrary *this_local;
  
  pDVar3 = DynamicObject::GetDynamicType(&function->super_DynamicObject);
  bVar2 = DynamicType::GetIsLocked(pDVar3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x163f,"(function->GetDynamicType()->GetIsLocked())",
                                "function->GetDynamicType()->GetIsLocked()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = VarIs<Js::ScriptFunction,Js::JavascriptFunction>(function);
  if ((bVar2) || (bVar2 = VarIs<Js::BoundFunction,Js::JavascriptFunction>(function), bVar2)) {
    SetCrossSiteForLockedNonBuiltInFunctionType(this,function);
  }
  else {
    pDVar3 = DynamicObject::GetDynamicType(&function->super_DynamicObject);
    pDVar5 = (DeferredTypeHandler<&Js::JavascriptExternalFunction::DeferredConstructorInitializer,_Js::DefaultDeferredTypeFilter,_false,_(unsigned_short)0,_(unsigned_short)0>
              *)DynamicType::GetTypeHandler(pDVar3);
    pSVar6 = GetScriptContext(this);
    pDVar7 = (DeferredTypeHandler<&Js::JavascriptExternalFunction::DeferredConstructorInitializer,_Js::DefaultDeferredTypeFilter,_false,_(unsigned_short)0,_(unsigned_short)0>
              *)GetDeferredPrototypeFunctionTypeHandler(pSVar6);
    if (pDVar5 != pDVar7) {
      pSVar6 = GetScriptContext(this);
      pDVar7 = (DeferredTypeHandler<&Js::JavascriptExternalFunction::DeferredConstructorInitializer,_Js::DefaultDeferredTypeFilter,_false,_(unsigned_short)0,_(unsigned_short)0>
                *)GetDeferredPrototypeFunctionWithLengthTypeHandler(pSVar6);
      if (pDVar5 != pDVar7) {
        pDVar7 = (DeferredTypeHandler<&Js::JavascriptExternalFunction::DeferredConstructorInitializer,_Js::DefaultDeferredTypeFilter,_false,_(unsigned_short)0,_(unsigned_short)0>
                  *)GetDeferredFunctionTypeHandler(this);
        if ((pDVar5 == pDVar7) ||
           (pDVar7 = (DeferredTypeHandler<&Js::JavascriptExternalFunction::DeferredConstructorInitializer,_Js::DefaultDeferredTypeFilter,_false,_(unsigned_short)0,_(unsigned_short)0>
                      *)GetDeferredFunctionWithLengthTypeHandler(this), pDVar5 == pDVar7)) {
          ppDVar8 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                              ((WriteBarrierPtr *)&this->crossSiteDeferredFunctionType);
          DynamicObject::ReplaceType(&function->super_DynamicObject,*ppDVar8);
          return;
        }
        pDVar7 = DeferredTypeHandler<&Js::JavascriptExternalFunction::DeferredConstructorInitializer,_Js::DefaultDeferredTypeFilter,_false,_(unsigned_short)0,_(unsigned_short)0>
                 ::GetDefaultInstance();
        if (pDVar5 == pDVar7) {
          ppDVar8 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                              ((WriteBarrierPtr *)
                               &this->crossSiteExternalConstructFunctionWithPrototypeType);
          DynamicObject::ReplaceType(&function->super_DynamicObject,*ppDVar8);
          return;
        }
        if (pDVar5 == (DeferredTypeHandler<&Js::JavascriptExternalFunction::DeferredConstructorInitializer,_Js::DefaultDeferredTypeFilter,_false,_(unsigned_short)0,_(unsigned_short)0>
                       *)SharedIdMappedFunctionWithPrototypeTypeHandler) {
          ppDVar8 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                              ((WriteBarrierPtr *)&this->crossSiteIdMappedFunctionWithPrototypeType)
          ;
          DynamicObject::ReplaceType(&function->super_DynamicObject,*ppDVar8);
          return;
        }
        SetCrossSiteForLockedNonBuiltInFunctionType(this,function);
        return;
      }
    }
    ppDVar8 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                        ((WriteBarrierPtr *)&this->crossSiteDeferredPrototypeFunctionType);
    DynamicObject::ReplaceType(&function->super_DynamicObject,*ppDVar8);
  }
  return;
}

Assistant:

void JavascriptLibrary::SetCrossSiteForLockedFunctionType(JavascriptFunction * function)
    {
        Assert(function->GetDynamicType()->GetIsLocked());

        if (VarIs<ScriptFunction>(function) || VarIs<BoundFunction>(function))
        {
            this->SetCrossSiteForLockedNonBuiltInFunctionType(function);
        }
        else
        {
            DynamicTypeHandler * typeHandler = function->GetDynamicType()->GetTypeHandler();
            if (typeHandler == JavascriptLibrary::GetDeferredPrototypeFunctionTypeHandler(this->GetScriptContext())
                || typeHandler == JavascriptLibrary::GetDeferredPrototypeFunctionWithLengthTypeHandler(this->GetScriptContext()))
            {
                function->ReplaceType(crossSiteDeferredPrototypeFunctionType);
            }
            else if (typeHandler == JavascriptLibrary::GetDeferredFunctionTypeHandler()
                || typeHandler == JavascriptLibrary::GetDeferredFunctionWithLengthTypeHandler())
            {
                function->ReplaceType(crossSiteDeferredFunctionType);
            }
            else if (typeHandler == Js::DeferredTypeHandler<Js::JavascriptExternalFunction::DeferredConstructorInitializer>::GetDefaultInstance())
            {
                function->ReplaceType(crossSiteExternalConstructFunctionWithPrototypeType);
            }
            else if (typeHandler == &SharedIdMappedFunctionWithPrototypeTypeHandler)
            {
                function->ReplaceType(crossSiteIdMappedFunctionWithPrototypeType);
            }
            else
            {
                this->SetCrossSiteForLockedNonBuiltInFunctionType(function);
            }
        }
    }